

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf_weights.cc
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  size_type sVar4;
  int iVar5;
  char *pcVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  size_type sVar8;
  vw *all;
  long lVar9;
  __ssize_t _Var10;
  size_t sVar11;
  example *ec;
  ostream *poVar12;
  size_t k;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  allocator local_d12;
  allocator local_d11;
  features *local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  char *line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  FILE *local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  string outdir;
  size_t len;
  string vwparams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  string infile;
  string target;
  string local_b98;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b78;
  options_description desc;
  ofstream right_quadratic;
  ofstream constant;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_6c0 [144];
  ofstream right_linear;
  ofstream left_quadratic;
  ofstream left_linear;
  
  infile._M_dataplus._M_p = (pointer)&infile.field_2;
  infile._M_string_length = 0;
  infile.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&outdir,".",(allocator *)&constant);
  vwparams._M_dataplus._M_p = (pointer)&vwparams.field_2;
  vwparams._M_string_length = 0;
  vwparams.field_2._M_local_buf[0] = '\0';
  boost::program_options::variables_map::variables_map(&vm);
  std::__cxx11::string::string((string *)&constant,"Allowed options",(allocator *)&left_linear);
  boost::program_options::options_description::options_description
            (&desc,(string *)&constant,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&constant);
  _constant = (pointer)boost::program_options::options_description::add_options();
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&constant,"help,h");
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&infile);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"infile,I",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&outdir);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"outdir,O",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&vwparams);
  boost::program_options::options_description_easy_init::operator()
            (pcVar6,(value_semantic *)"vwparams",(char *)ptVar7);
  local_b78.super_function_base.vtable = (vtable_base *)0x0;
  local_b78.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_b78.super_function_base.functor._8_8_ = 0;
  local_b78.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&constant,argc,argv,&desc,0,&local_b78);
  boost::program_options::store((basic_parsed_options *)&constant,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&constant);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_b78);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&constant,"help",(allocator *)&left_linear);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_6c0,(key_type *)&constant);
  sVar4 = vwparams._M_string_length;
  if ((sVar8 == 0) && (infile._M_string_length != 0)) {
    std::__cxx11::string::~string((string *)&constant);
    if (sVar4 != 0) {
      std::__cxx11::string::string((string *)&local_b98,(string *)&vwparams);
      all = VW::initialize(&local_b98,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
      std::__cxx11::string::~string((string *)&local_b98);
      all->audit = true;
      std::__cxx11::string::string((string *)&target,"--rank ",(allocator *)&constant);
      lVar9 = std::__cxx11::string::find((string *)&vwparams,(ulong)&target);
      iVar5 = atoi(vwparams._M_dataplus._M_p + target._M_string_length + lVar9);
      pbVar3 = (byte *)(((all->pairs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      bVar1 = *pbVar3;
      bVar2 = pbVar3[1];
      local_c80 = fopen64(infile._M_dataplus._M_p,"r");
      line = (char *)0x0;
      len = 0;
      std::__cxx11::string::string((string *)&right_linear,"/",(allocator *)&local_cc8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &left_quadratic,&outdir,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_linear);
      std::__cxx11::string::string((string *)&right_quadratic,"constant",(allocator *)&local_d08);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &left_linear,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &left_quadratic,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic);
      std::ofstream::ofstream(&constant,_left_linear,_S_out);
      std::__cxx11::string::~string((string *)&left_linear);
      std::__cxx11::string::~string((string *)&right_quadratic);
      std::__cxx11::string::~string((string *)&left_quadratic);
      std::__cxx11::string::~string((string *)&right_linear);
      std::__cxx11::string::string((string *)&local_cc8,"/",(allocator *)&local_ca0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic,&outdir,&local_cc8);
      local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d08,'\x01');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_linear,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic,&local_d08);
      std::__cxx11::string::string((string *)&local_ce8,".linear",(allocator *)&local_c78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &left_quadratic,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_linear,&local_ce8);
      std::ofstream::ofstream(&left_linear,_left_quadratic,_S_out);
      std::__cxx11::string::~string((string *)&left_quadratic);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&right_linear);
      std::__cxx11::string::~string((string *)&local_d08);
      std::__cxx11::string::~string((string *)&right_quadratic);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::string((string *)&local_d08,"/",(allocator *)&local_c78);
      std::operator+(&local_cc8,&outdir,&local_d08);
      local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_ce8,'\x01');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic,&local_cc8,&local_ce8);
      std::__cxx11::string::string((string *)&local_ca0,".quadratic",(allocator *)&local_bf8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_linear,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic,&local_ca0);
      std::ofstream::ofstream(&left_quadratic,_right_linear,_S_out);
      std::__cxx11::string::~string((string *)&right_linear);
      std::__cxx11::string::~string((string *)&local_ca0);
      std::__cxx11::string::~string((string *)&right_quadratic);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_d08);
      std::__cxx11::string::string((string *)&local_ce8,"/",(allocator *)&local_bf8);
      std::operator+(&local_d08,&outdir,&local_ce8);
      local_ca0._M_dataplus._M_p = (pointer)&local_ca0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_ca0,'\x01');
      std::operator+(&local_cc8,&local_d08,&local_ca0);
      std::__cxx11::string::string((string *)&local_c78,".linear",&local_d12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &right_quadratic,&local_cc8,&local_c78);
      std::ofstream::ofstream(&right_linear,_right_quadratic,_S_out);
      std::__cxx11::string::~string((string *)&right_quadratic);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_d08);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::string((string *)&local_ca0,"/",&local_d12);
      std::operator+(&local_ce8,&outdir,&local_ca0);
      local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c78,'\x01');
      std::operator+(&local_d08,&local_ce8,&local_c78);
      std::__cxx11::string::string((string *)&local_bf8,".quadratic",&local_d11);
      std::operator+(&local_cc8,&local_d08,&local_bf8);
      std::ofstream::ofstream(&right_quadratic,local_cc8._M_dataplus._M_p,_S_out);
      uVar15 = (ulong)iVar5;
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_bf8);
      std::__cxx11::string::~string((string *)&local_d08);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_ca0);
      ec = (example *)0x0;
      while( true ) {
        _Var10 = getline(&line,&len,local_c80);
        pcVar6 = line;
        if (_Var10 == -1) break;
        sVar11 = strlen(line);
        pcVar6[sVar11 - 1] = '\0';
        ec = VW::read_example(all,line);
        local_d10 = (ec->super_example_predict).feature_space;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)(ec->super_example_predict).feature_space[bVar1].values._end -
                             (long)(ec->super_example_predict).feature_space[bVar1].values._begin >>
                            2); uVar14 = uVar14 + 1) {
          poVar12 = std::operator<<((ostream *)&left_linear,
                                    (string *)
                                    &((ec->super_example_predict).feature_space[bVar1].space_names.
                                      _begin[uVar14].
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->second);
          poVar12 = std::operator<<(poVar12,'\t');
          std::ostream::operator<<
                    (poVar12,(all->weights).dense_weights._begin
                             [(all->weights).dense_weights._weight_mask &
                              (ec->super_example_predict).feature_space[bVar1].indicies._begin
                              [uVar14]]);
          std::operator<<((ostream *)&left_quadratic,
                          (string *)
                          &((ec->super_example_predict).feature_space[bVar1].space_names._begin
                            [uVar14].
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->second);
          for (uVar13 = 1; uVar13 <= uVar15; uVar13 = uVar13 + 1) {
            poVar12 = std::operator<<((ostream *)&left_quadratic,'\t');
            std::ostream::operator<<
                      (poVar12,(all->weights).dense_weights._begin
                               [(ec->super_example_predict).feature_space[bVar1].indicies._begin
                                [uVar14] + uVar13 & (all->weights).dense_weights._weight_mask]);
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&left_linear);
        std::endl<char,std::char_traits<char>>((ostream *)&left_quadratic);
        local_d10 = local_d10 + bVar2;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)(local_d10->values)._end - (long)(local_d10->values)._begin >> 2)
            ; uVar14 = uVar14 + 1) {
          poVar12 = std::operator<<((ostream *)&right_linear,
                                    (string *)
                                    &((local_d10->space_names)._begin[uVar14].
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->second);
          poVar12 = std::operator<<(poVar12,'\t');
          std::ostream::operator<<
                    (poVar12,(all->weights).dense_weights._begin
                             [(all->weights).dense_weights._weight_mask &
                              (ec->super_example_predict).feature_space[bVar1].indicies._begin
                              [uVar14]]);
          std::operator<<((ostream *)&right_quadratic,
                          (string *)
                          &((local_d10->space_names)._begin[uVar14].
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->second);
          for (uVar13 = 1; uVar13 <= uVar15; uVar13 = uVar13 + 1) {
            poVar12 = std::operator<<((ostream *)&right_quadratic,'\t');
            std::ostream::operator<<
                      (poVar12,(all->weights).dense_weights._begin
                               [uVar15 + uVar13 +
                                (ec->super_example_predict).feature_space[bVar1].indicies._begin
                                [uVar14] & (all->weights).dense_weights._weight_mask]);
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&right_linear);
        std::endl<char,std::char_traits<char>>((ostream *)&right_quadratic);
        VW::finish_example(all,ec);
      }
      poVar12 = (ostream *)
                std::ostream::operator<<
                          (&constant,
                           (all->weights).dense_weights._begin
                           [(all->weights).dense_weights._weight_mask &
                            *(ec->super_example_predict).feature_space[0x80].indicies._begin]);
      std::endl<char,std::char_traits<char>>(poVar12);
      VW::finish(all,true);
      fclose(local_c80);
      std::ofstream::~ofstream(&right_quadratic);
      std::ofstream::~ofstream(&right_linear);
      std::ofstream::~ofstream(&left_quadratic);
      std::ofstream::~ofstream(&left_linear);
      std::ofstream::~ofstream(&constant);
      std::__cxx11::string::~string((string *)&target);
      iVar5 = 0;
      goto LAB_00117109;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&constant);
  }
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "Dumps weights for matrix factorization model (gd_mf).");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "The constant will be written to <outdir>/constant.");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "Linear and quadratic weights corresponding to the input features will be "
                           );
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively."
                           );
  std::endl<char,std::char_traits<char>>(poVar12);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar12 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
  std::operator<<(poVar12,"\n");
  poVar12 = std::operator<<((ostream *)&std::cout,"Example usage:");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:"
                           );
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "    echo \'|u 42 |i 7\' | ./gd_mf_weights -I /dev/stdin --vwparams \'-q ui --rank 10\'"
                           );
  std::endl<char,std::char_traits<char>>(poVar12);
  iVar5 = 1;
LAB_00117109:
  boost::program_options::options_description::~options_description(&desc);
  boost::program_options::variables_map::~variables_map(&vm);
  std::__cxx11::string::~string((string *)&vwparams);
  std::__cxx11::string::~string((string *)&outdir);
  std::__cxx11::string::~string((string *)&infile);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{ string infile;
  string outdir(".");
  string vwparams;

  po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("infile,I", po::value<string>(&infile), "input (in vw format) of weights to extract")
  ("outdir,O", po::value<string>(&outdir), "directory to write model files to (default: .)")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model.reg -t ...")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help") || infile.empty() || vwparams.empty())
  { cout << "Dumps weights for matrix factorization model (gd_mf)." << endl;
    cout << "The constant will be written to <outdir>/constant." << endl;
    cout << "Linear and quadratic weights corresponding to the input features will be " << endl;
    cout << "written to <outdir>/<ns>.linear and <outdir>/<ns>.quadratic,respectively." << endl;
    cout << endl;
    cout << desc << "\n";
    cout << "Example usage:" << endl;
    cout << "    Extract weights for user 42 and item 7 under randomly initialized rank 10 model:" << endl;
    cout << "    echo '|u 42 |i 7' | ./gd_mf_weights -I /dev/stdin --vwparams '-q ui --rank 10'" << endl;
    return 1;
  }

  // initialize model
  vw* model = VW::initialize(vwparams);
  model->audit = true;

  string target("--rank ");
  size_t loc = vwparams.find(target);
  const char* location = vwparams.c_str()+loc+target.size();
  size_t rank = atoi(location);

  // global model params
  unsigned char left_ns = model->pairs[0][0];
  unsigned char right_ns = model->pairs[0][1];
  dense_parameters& weights = model->weights.dense_weights;

  // const char *filename = argv[0];
  FILE* file = fopen(infile.c_str(), "r");
  char* line = NULL;
  size_t len = 0;
  ssize_t read;

  // output files
  ofstream constant((outdir + string("/") + string("constant")).c_str()),
           left_linear((outdir + string("/") + string(1, left_ns) + string(".linear")).c_str()),
           left_quadratic((outdir + string("/") + string(1, left_ns) + string(".quadratic")).c_str()),
           right_linear((outdir + string("/") + string(1, right_ns) + string(".linear")).c_str()),
           right_quadratic((outdir + string("/") + string(1, right_ns) + string(".quadratic")).c_str());

  example *ec = NULL;
  while ((read = getline(&line, &len, file)) != -1)
  { line[strlen(line)-1] = 0; // chop

    ec = VW::read_example(*model, line);

    // write out features for left namespace
    features& left = ec->feature_space[left_ns];
    for (size_t i = 0; i < left.size(); ++i)
    { left_linear << left.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      left_quadratic << left.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        left_quadratic << '\t' << weights[(left.indicies[i] + k)];
    }
    left_linear << endl;
    left_quadratic << endl;

    // write out features for right namespace
    features& right = ec->feature_space[right_ns];
    for (size_t i = 0; i < right.size(); ++i)
    { right_linear << right.space_names[i].get()->second << '\t' << weights[left.indicies[i]];

      right_quadratic << right.space_names[i].get()->second;
      for (size_t k = 1; k <= rank; k++)
        right_quadratic << '\t' << weights[(left.indicies[i] + k + rank)];
    }
    right_linear << endl;
    right_quadratic << endl;

    VW::finish_example(*model, *ec);
  }

  // write constant
  constant << weights[ec->feature_space[constant_namespace].indicies[0]] << endl;

  // clean up
  VW::finish(*model);
  fclose(file);
}